

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Greetings.cpp
# Opt level: O0

void __thiscall
RenX_GreetingsPlugin::RenX_OnJoin::anon_class_24_3_00aaa707::operator()
          (anon_class_24_3_00aaa707 *this,string *raw_message)

{
  RenX_GreetingsPlugin *pRVar1;
  Server *pSVar2;
  PlayerInfo *pPVar3;
  __sv_type _Var4;
  size_t local_68;
  char *local_60;
  size_t local_58;
  char *local_50;
  string local_38 [8];
  string msg;
  string *raw_message_local;
  anon_class_24_3_00aaa707 *this_local;
  
  pRVar1 = this->this;
  msg.field_2._8_8_ = raw_message;
  std::__cxx11::string::string(local_38,raw_message);
  RenX::sanitizeTags(local_38);
  RenX::processTags(local_38,this->server,this->player,(PlayerInfo *)0x0,(BuildingInfo *)0x0);
  if ((pRVar1->m_sendPrivate & 1U) == 0) {
    pSVar2 = this->server;
    _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view(local_38);
    local_68 = _Var4._M_len;
    local_60 = _Var4._M_str;
    RenX::Server::sendMessage(pSVar2,local_68,local_60);
  }
  else {
    pSVar2 = this->server;
    pPVar3 = this->player;
    _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view(local_38);
    local_58 = _Var4._M_len;
    local_50 = _Var4._M_str;
    RenX::Server::sendMessage(pSVar2,pPVar3,local_58,local_50);
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void RenX_GreetingsPlugin::RenX_OnJoin(RenX::Server &server, const RenX::PlayerInfo &player) {
	auto sendMessage = [&](const std::string& raw_message) {
		std::string msg = raw_message;

		RenX::sanitizeTags(msg);
		RenX::processTags(msg, &server, &player);

		if (m_sendPrivate)
			server.sendMessage(player, msg);
		else
			server.sendMessage(msg);
	};

	if (player.isBot == false && server.isMatchInProgress()) {
		switch (m_sendMode) {
		case 0:
			m_lastLine = rand() % m_greetingsFile.getLineCount();
			sendMessage(m_greetingsFile.getLine(m_lastLine));
			break;
		case 1:
			if (++m_lastLine == m_greetingsFile.getLineCount())
				m_lastLine = 0;
			sendMessage(m_greetingsFile.getLine(m_lastLine));
			break;
		case 2:
			for (m_lastLine = 0; m_lastLine != m_greetingsFile.getLineCount(); m_lastLine++)
				sendMessage(m_greetingsFile.getLine(m_lastLine));
			break;
		default:
			return;
		}
	}
}